

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionResultBuilder::ExpressionResultBuilder
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  string local_48 [48];
  ExpressionResultBuilder *local_18;
  ExpressionResultBuilder *other_local;
  ExpressionResultBuilder *this_local;
  
  local_18 = other;
  other_local = this;
  AssertionResultData::AssertionResultData(&this->m_data,&other->m_data);
  ExprComponents::ExprComponents(&this->m_exprComponents,&local_18->m_exprComponents);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)&this->m_stream,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

ExpressionResultBuilder::ExpressionResultBuilder( const ExpressionResultBuilder& other )
    :   m_data( other.m_data ),
        m_exprComponents( other.m_exprComponents )
    {
        m_stream << other.m_stream.str();
    }